

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::map(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  undefined1 auVar1 [48];
  undefined8 *puVar2;
  uint32_t uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> local_80;
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  (this->hash_trie_).capa_size_.mask_ = 0;
  (this->hash_trie_).symb_size_.bits_ = 0;
  (this->hash_trie_).capa_size_.bits_ = 0;
  auVar5 = vmovdqu64_avx512f(auVar4);
  auVar1 = auVar5._0_48_;
  (this->hash_trie_).table_.chunks_ =
       (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar1._0_24_;
  (this->hash_trie_).table_.size_ = auVar1._24_8_;
  (this->hash_trie_).table_.mask_ = auVar1._32_8_;
  (this->hash_trie_).table_.width_ = auVar1._40_8_;
  (this->hash_trie_).size_ = auVar5._48_8_;
  (this->hash_trie_).max_size_ = auVar5._56_8_;
  this->size_ = 0;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xb8) = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])&(this->hash_trie_).symb_size_.mask_ = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])&(this->label_store_).label_bytes_ = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x38) = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x78) = auVar5;
  auVar5 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc4) = auVar5;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar3 = 8;
    if (1 < lambda) {
      uVar3 = 0x48 - (int)LZCOUNT(lambda - 1);
    }
    auVar5 = ZEXT2464(ZEXT1624((undefined1  [16])0x0));
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::plain_bonsai_trie(&local_80,capa_bits,uVar3)
    ;
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::operator=(&this->hash_trie_,&local_80);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80);
    compact_bonsai_nlm<int,_64UL>::compact_bonsai_nlm
              ((compact_bonsai_nlm<int,_64UL> *)&local_80,(this->hash_trie_).capa_size_.bits_);
    compact_bonsai_nlm<int,_64UL>::operator=
              (&this->label_store_,(compact_bonsai_nlm<int,_64UL> *)&local_80);
    compact_bonsai_nlm<int,_64UL>::~compact_bonsai_nlm((compact_bonsai_nlm<int,_64UL> *)&local_80);
    auVar4 = vpternlogd_avx512f(auVar5,auVar5,auVar5,0xff);
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar5;
    uVar3 = this->num_codes_;
    this->num_codes_ = uVar3 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar3;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_00189a50;
  puVar2[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar2,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }